

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_parquet_relation.cpp
# Opt level: O1

BoundStatement * __thiscall
duckdb::WriteParquetRelation::Bind
          (BoundStatement *__return_storage_ptr__,WriteParquetRelation *this,Binder *binder)

{
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> uVar3;
  CopyInfo *this_00;
  Relation *pRVar4;
  pointer pCVar5;
  templated_unique_single_t info;
  CopyStatement copy;
  _Head_base<0UL,_duckdb::CopyInfo_*,_false> local_b0;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_a8;
  CopyStatement local_a0;
  
  CopyStatement::CopyStatement(&local_a0);
  this_00 = (CopyInfo *)operator_new(0x110);
  CopyInfo::CopyInfo(this_00);
  local_b0._M_head_impl = this_00;
  pRVar4 = shared_ptr<duckdb::Relation,_true>::operator->(&this->child);
  (*pRVar4->_vptr_Relation[3])(&local_a8,pRVar4);
  pCVar5 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_b0);
  _Var2._M_head_impl = local_a8._M_head_impl;
  local_a8._M_head_impl = (QueryNode *)0x0;
  _Var1._M_head_impl =
       (pCVar5->select_statement).
       super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pCVar5->select_statement).
  super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_QueryNode + 8))();
  }
  if (local_a8._M_head_impl != (QueryNode *)0x0) {
    (*(local_a8._M_head_impl)->_vptr_QueryNode[1])();
  }
  pCVar5 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_b0);
  pCVar5->is_from = false;
  pCVar5 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_b0);
  ::std::__cxx11::string::_M_assign((string *)&pCVar5->file_path);
  pCVar5 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_b0);
  ::std::__cxx11::string::_M_replace
            ((ulong)&pCVar5->format,0,(char *)(pCVar5->format)._M_string_length,0x1e23c82);
  pCVar5 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_b0);
  if (&this->options != &pCVar5->options) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&pCVar5->options,&(this->options)._M_h);
  }
  uVar3.super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
  super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)
       (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)local_a0.info;
  local_a0.info.super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
  super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)
       (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)local_b0._M_head_impl;
  local_b0._M_head_impl = (CopyInfo *)0x0;
  if (uVar3.super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
      super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true,_true>)0x0) {
    (*((ParseInfo *)
      uVar3.super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
      super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl)->_vptr_ParseInfo[1])();
  }
  Binder::Bind(__return_storage_ptr__,binder,&local_a0.super_SQLStatement);
  if (local_b0._M_head_impl != (CopyInfo *)0x0) {
    (*((local_b0._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  local_a0.super_SQLStatement._vptr_SQLStatement = (_func_int **)&PTR__CopyStatement_02492c28;
  if (local_a0.info.super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
      super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true,_true>)0x0) {
    (**(code **)(*(long *)local_a0.info.
                          super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>
                          .super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl + 8))();
  }
  local_a0.info.super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
  super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)
       (__uniq_ptr_data<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true,_true>)0x0;
  SQLStatement::~SQLStatement(&local_a0.super_SQLStatement);
  return __return_storage_ptr__;
}

Assistant:

BoundStatement WriteParquetRelation::Bind(Binder &binder) {
	CopyStatement copy;
	auto info = make_uniq<CopyInfo>();
	info->select_statement = child->GetQueryNode();
	info->is_from = false;
	info->file_path = parquet_file;
	info->format = "parquet";
	info->options = options;
	copy.info = std::move(info);
	return binder.Bind(copy.Cast<SQLStatement>());
}